

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O3

bool Kernel::SortHelper::areSortsValid
               (Term *t0,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *varSorts)

{
  uint *puVar1;
  Term *t;
  bool bVar2;
  TermList t_00;
  TermList TVar3;
  ulong uVar4;
  uint argIndex;
  undefined8 *puVar5;
  TermList argSrt;
  TermList varSrt;
  TermList local_78;
  TermList local_70;
  NonVariableIterator local_68;
  
  NonVariableIterator::NonVariableIterator(&local_68,t0,true);
  bVar2 = true;
  if (local_68._stack._cursor != local_68._stack._stack) {
    do {
      t_00 = NonVariableIterator::next(&local_68);
      uVar4 = (ulong)(*(uint *)(t_00._content + 0xc) & 0xfffffff);
      if ((*(uint *)(t_00._content + 0x28 + uVar4 * 8) & 3) != 2) {
        puVar5 = (undefined8 *)(uVar4 * 8 + 0x28 + t_00._content);
        argIndex = 0;
        do {
          local_78 = getArgSort(t_00._content,argIndex);
          t = (Term *)*puVar5;
          if (((ulong)t & 1) == 0) {
            TVar3 = getResultSort(t);
            if (local_78._content != TVar3._content) {
LAB_005ba2af:
              bVar2 = false;
              goto LAB_005ba2b6;
            }
          }
          else {
            local_70._content = 2;
            bVar2 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                    ::findOrInsert(varSorts,(uint)((ulong)t >> 2),&local_70,&local_78);
            if ((!bVar2) && (local_70._content != local_78._content)) goto LAB_005ba2af;
          }
          argIndex = argIndex + 1;
          puVar1 = (uint *)(puVar5 + -1);
          puVar5 = puVar5 + -1;
        } while ((*puVar1 & 3) != 2);
      }
    } while (local_68._stack._cursor != local_68._stack._stack);
    bVar2 = true;
  }
LAB_005ba2b6:
  local_68.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
       (_func_int **)&PTR__NonVariableIterator_00b3db38;
  if (local_68._stack._stack != (Term **)0x0) {
    uVar4 = local_68._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack._stack;
    }
    else if (uVar4 < 0x11) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack._stack;
    }
    else if (uVar4 < 0x19) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack._stack;
    }
    else if (uVar4 < 0x21) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack._stack;
    }
    else if (uVar4 < 0x31) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack._stack;
    }
    else if (uVar4 < 0x41) {
      *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack._stack;
    }
    else {
      operator_delete(local_68._stack._stack,0x10);
    }
  }
  return bVar2;
}

Assistant:

bool SortHelper::areSortsValid(Term* t0, DHMap<unsigned,TermList>& varSorts)
{
  NonVariableIterator sit(t0,true);
  while (sit.hasNext()) {
    Term* t = sit.next().term();
    int idx = 0;
    TermList* args = t->args();
    while (!args->isEmpty()) {
      TermList argSrt = getArgSort(t,idx);
      TermList arg = *args;
      if (arg.isVar()) {
        TermList varSrt;
        if (!varSorts.findOrInsert(arg.var(), varSrt, argSrt)) {
          //the variable is not new
          if (varSrt != argSrt) {
            return false;
          }
        }
      } else {
        if (argSrt != getResultSort(arg.term())) {
          return false;
        }
      }
      idx++;
      args=args->next();
    }
  }
  return true;
}